

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O2

vector<duckdb::LogicalType,_true> *
duckdb::TableFunctionExtractor::GetParameterLogicalTypes
          (vector<duckdb::LogicalType,_true> *__return_storage_ptr__,
          TableFunctionCatalogEntry *entry,idx_t offset)

{
  TableFunction fun;
  TableFunction local_1c0;
  
  FunctionSet<duckdb::TableFunction>::GetFunctionByOffset
            (&local_1c0,&(entry->functions).super_FunctionSet<duckdb::TableFunction>,offset);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&__return_storage_ptr__->
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &local_1c0.super_SimpleNamedParameterFunction.super_SimpleFunction.arguments.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  TableFunction::~TableFunction(&local_1c0);
  return __return_storage_ptr__;
}

Assistant:

static vector<LogicalType> GetParameterLogicalTypes(TableFunctionCatalogEntry &entry, idx_t offset) {
		auto fun = entry.functions.GetFunctionByOffset(offset);
		return fun.arguments;
	}